

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O1

int tclpkcs11_list_slots(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var1;
  long lVar2;
  CK_RV errorCode;
  char *pcVar3;
  Tcl_Obj *pTVar4;
  Tcl_Obj *pTVar5;
  Tcl_Obj *pTVar6;
  Tcl_Obj *pTVar7;
  ulong uVar8;
  ProcErrorProc *pPVar9;
  CK_ULONG numSlots;
  CK_TOKEN_INFO tokenInfo;
  CK_SLOT_INFO slotInfo;
  Tcl_Obj *local_1a8;
  int local_1a0;
  undefined4 uStack_19c;
  Tcl_Obj *local_198;
  Tcl_Obj *local_190;
  long local_188;
  char *local_180;
  ulong local_178;
  char local_170 [32];
  char local_150 [32];
  char local_130 [16];
  char local_120 [16];
  byte local_110;
  byte local_10f;
  byte local_10e;
  char local_a0 [96];
  byte local_40;
  
  if (cd == (ClientData)0x0) {
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar3 = "invalid clientdata";
  }
  else if (objc == 2) {
    lVar2 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar2 != 0) && (lVar2 = *(long *)(lVar2 + 0x18), lVar2 != 0)) {
      errorCode = (**(code **)(*(long *)(lVar2 + 8) + 0x28))(0,0,&local_1a0);
      if (errorCode == 0) {
        pcVar3 = (*tclStubsPtr->tcl_Alloc)(local_1a0 << 3);
        errorCode = (**(code **)(*(long *)(lVar2 + 8) + 0x28))(0,pcVar3,&local_1a0);
        if (errorCode == 0) {
          local_180 = pcVar3;
          local_190 = (*tclStubsPtr->tcl_NewObj)();
          if (CONCAT44(uStack_19c,local_1a0) != 0) {
            uVar8 = 0;
            local_188 = lVar2;
            do {
              pcVar3 = local_180;
              lVar2 = (**(code **)(*(long *)(local_188 + 8) + 0x30))
                                (*(undefined8 *)(local_180 + uVar8 * 8),local_a0);
              pTVar4 = (*tclStubsPtr->tcl_NewObj)();
              p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
              local_178 = uVar8;
              pTVar5 = (*tclStubsPtr->tcl_NewLongObj)(*(long *)(pcVar3 + uVar8 * 8));
              (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar4,pTVar5);
              pTVar5 = (*tclStubsPtr->tcl_NewObj)();
              if (lVar2 == 0) {
                local_1a8 = (*tclStubsPtr->tcl_NewObj)();
                if ((local_40 & 1) == 0) {
LAB_00102696:
                  pTVar6 = (Tcl_Obj *)0x0;
                }
                else {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("TOKEN_PRESENT",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  lVar2 = (**(code **)(*(long *)(local_188 + 8) + 0x38))
                                    (*(undefined8 *)(local_180 + local_178 * 8),local_170);
                  if (lVar2 != 0) goto LAB_00102696;
                  local_198 = (*tclStubsPtr->tcl_NewStringObj)(local_170,0x20);
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(local_170,0x20);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,local_1a8,pTVar6);
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(local_150,0x20);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,local_1a8,pTVar6);
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(local_130,0x10);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,local_1a8,pTVar6);
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(local_120,0x10);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,local_1a8,pTVar6);
                  if ((local_110 & 1) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("RNG",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_110 & 2) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("WRITE_PROTECTED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_110 & 4) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("LOGIN_REQUIRED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_110 & 8) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_INITIALIZED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_110 & 0x20) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("RESTORE_KEY_NOT_NEEDED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_110 & 0x40) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("CLOCK_ON_TOKEN",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10f & 1) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("PROTECTED_AUTHENTICATION_PATH",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10f & 2) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("DUAL_CRYPTO_OPERATIONS",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10f & 4) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("TOKEN_INITIALIZED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10f & 8) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("SECONDARY_AUTHENTICATION",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10e & 1) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_COUNT_LOW",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10e & 2) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_FINAL_TRY",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10e & 4) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_LOCKED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10e & 8) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_TO_BE_CHANGED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10e & 0x10) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_COUNT_LOW",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10e & 0x20) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_FINAL_TRY",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  if ((local_10e & 0x40) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_LOCKED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                  }
                  pTVar6 = local_198;
                  if ((local_10e & 0x80) != 0) {
                    p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_TO_BE_CHANGED",-1);
                    (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar6);
                    pTVar6 = local_198;
                  }
                }
                if ((local_40 & 2) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("REMOVABLE_DEVICE",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                }
                if ((local_40 & 4) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("HW_SLOT",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar5,pTVar7);
                }
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                if (pTVar6 == (Tcl_Obj *)0x0) {
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(local_a0,0x20);
                }
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar4,pTVar6);
                (*tclStubsPtr->tcl_ListObjAppendElement)
                          ((Tcl_Interp_conflict *)interp,pTVar4,pTVar5);
              }
              else {
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(anon_var_dwarf_1c08 + 10,0);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar4,pTVar6);
                local_1a8 = pTVar5;
              }
              (*tclStubsPtr->tcl_ListObjAppendElement)
                        ((Tcl_Interp_conflict *)interp,pTVar4,local_1a8);
              (*tclStubsPtr->tcl_ListObjAppendElement)
                        ((Tcl_Interp_conflict *)interp,local_190,pTVar4);
              uVar8 = local_178 + 1;
            } while (uVar8 < CONCAT44(uStack_19c,local_1a0));
          }
          (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,local_190);
          return 0;
        }
      }
      pPVar9 = tclStubsPtr->tcl_SetObjResult;
      pTVar4 = tclpkcs11_pkcs11_error(errorCode);
      goto LAB_00102556;
    }
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar3 = "invalid handle";
  }
  else {
    pPVar9 = tclStubsPtr->tcl_SetObjResult;
    pcVar3 = "wrong # args: should be \"pki::pkcs11::listslots handle\"";
  }
  pTVar4 = (*tclStubsPtr->tcl_NewStringObj)(pcVar3,-1);
LAB_00102556:
  (*pPVar9)((Tcl_Interp_conflict *)interp,pTVar4);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_slots(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle;
  Tcl_Obj *ret_list, *curr_item_list, *flags_list, *slot_desc, *token_desc;

  CK_SLOT_ID_PTR slots;
  CK_SLOT_INFO slotInfo;
  CK_TOKEN_INFO tokenInfo;
  CK_ULONG numSlots, currSlot;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 2) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listslots handle\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_GetSlotList(FALSE, NULL, &numSlots);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  slots = (CK_SLOT_ID_PTR) ckalloc(sizeof(*slots) * numSlots);

  chk_rv = handle->pkcs11->C_GetSlotList(FALSE, slots, &numSlots);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();

  for (currSlot = 0; currSlot < numSlots; currSlot++) {
    chk_rv = handle->pkcs11->C_GetSlotInfo(slots[currSlot], &slotInfo);

    curr_item_list = Tcl_NewObj();
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewLongObj(slots[currSlot]));

    flags_list = Tcl_NewObj();

    if (chk_rv != CKR_OK) {
      /* Add an empty string as the token label */
      Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("", 0));

      /* Add the list of existing flags (none) */
      Tcl_ListObjAppendElement(interp, curr_item_list, flags_list);

      /* Add this item to the list */
      Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);

      continue;
    }

    slot_desc = NULL;
    token_desc = Tcl_NewObj();

    if ((slotInfo.flags & CKF_TOKEN_PRESENT) == CKF_TOKEN_PRESENT) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("TOKEN_PRESENT", -1));

      chk_rv = handle->pkcs11->C_GetTokenInfo(slots[currSlot], &tokenInfo);

      if (chk_rv == CKR_OK) {
        /* Add the token label as the slot label */
        if (!slot_desc) {
          slot_desc = Tcl_NewStringObj((const char *) tokenInfo.label, 32);
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.label, 32));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.manufacturerID, 32));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.model, 16));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.serialNumber, 16));
        }

        if ((tokenInfo.flags & CKF_RNG) == CKF_RNG) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("RNG", -1));
        }
        if ((tokenInfo.flags & CKF_WRITE_PROTECTED) == CKF_WRITE_PROTECTED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("WRITE_PROTECTED", -1));
        }
        if ((tokenInfo.flags & CKF_LOGIN_REQUIRED) == CKF_LOGIN_REQUIRED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("LOGIN_REQUIRED", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_INITIALIZED) == CKF_USER_PIN_INITIALIZED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_INITIALIZED", -1));
        }
        if ((tokenInfo.flags & CKF_RESTORE_KEY_NOT_NEEDED) == CKF_RESTORE_KEY_NOT_NEEDED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("RESTORE_KEY_NOT_NEEDED", -1));
        }
        if ((tokenInfo.flags & CKF_CLOCK_ON_TOKEN) == CKF_CLOCK_ON_TOKEN) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("CLOCK_ON_TOKEN", -1));
        }
        if ((tokenInfo.flags & CKF_PROTECTED_AUTHENTICATION_PATH) == CKF_PROTECTED_AUTHENTICATION_PATH) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("PROTECTED_AUTHENTICATION_PATH", -1));
        }
        if ((tokenInfo.flags & CKF_DUAL_CRYPTO_OPERATIONS) == CKF_DUAL_CRYPTO_OPERATIONS) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("DUAL_CRYPTO_OPERATIONS", -1));
        }
        if ((tokenInfo.flags & CKF_TOKEN_INITIALIZED) == CKF_TOKEN_INITIALIZED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("TOKEN_INITIALIZED", -1));
        }
        if ((tokenInfo.flags & CKF_SECONDARY_AUTHENTICATION) == CKF_SECONDARY_AUTHENTICATION) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SECONDARY_AUTHENTICATION", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_COUNT_LOW) == CKF_USER_PIN_COUNT_LOW) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_COUNT_LOW", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_FINAL_TRY) == CKF_USER_PIN_FINAL_TRY) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_FINAL_TRY", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_LOCKED) == CKF_USER_PIN_LOCKED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_LOCKED", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_TO_BE_CHANGED) == CKF_USER_PIN_TO_BE_CHANGED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_TO_BE_CHANGED", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_COUNT_LOW) == CKF_SO_PIN_COUNT_LOW) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_COUNT_LOW", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_FINAL_TRY) == CKF_SO_PIN_FINAL_TRY) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_FINAL_TRY", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_LOCKED) == CKF_SO_PIN_LOCKED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_LOCKED", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_TO_BE_CHANGED) == CKF_SO_PIN_TO_BE_CHANGED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_TO_BE_CHANGED", -1));
        }
      }
    }

    /* Add additional slot flags */
    if ((slotInfo.flags & CKF_REMOVABLE_DEVICE) == CKF_REMOVABLE_DEVICE) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("REMOVABLE_DEVICE", -1));
    }
    if ((slotInfo.flags & CKF_HW_SLOT) == CKF_HW_SLOT) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("HW_SLOT", -1));
    }

    if (slot_desc) {
      /* If we found a more descriptive slot description, use it */
      Tcl_ListObjAppendElement(interp, curr_item_list, slot_desc);
    } else {
      /* Add the slot description as the label for tokens with nothing in them */
      Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj((const char *) slotInfo.slotDescription, 32));
    }
    		
    Tcl_ListObjAppendElement(interp, curr_item_list, flags_list);

    /*Descryption token*/
    Tcl_ListObjAppendElement(interp, curr_item_list, token_desc);

    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  Tcl_SetObjResult(interp, ret_list);

  return(TCL_OK);
}